

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

int hex_encode(void *in_buf,uint in_size,char *out_buf,uint out_size,int lowercase)

{
  char *pcVar1;
  char *pcVar2;
  char *out_end;
  char *out;
  uchar *in_end;
  uchar *in;
  char *xdigits;
  int lowercase_local;
  uint out_size_local;
  char *out_buf_local;
  uint in_size_local;
  void *in_buf_local;
  int local_4;
  
  pcVar1 = "0123456789ABCDEF";
  if (lowercase != 0) {
    pcVar1 = "0123456789abcdef";
  }
  if (out_buf == (char *)0x0) {
    local_4 = in_size * 2 + 1;
  }
  else if (out_size < in_size << 1) {
    local_4 = -1;
  }
  else {
    out = out_buf;
    for (in = (uchar *)in_buf;
        in < (uchar *)((long)in_buf + (ulong)in_size) && out + 1 < out_buf + out_size; in = in + 1)
    {
      pcVar2 = out + 1;
      *out = pcVar1[(int)(*in & 0xf0) >> 4];
      out = out + 2;
      *pcVar2 = pcVar1[(int)(*in & 0xf)];
    }
    if (out < out_buf + out_size) {
      *out = '\0';
    }
    local_4 = (int)out - (int)out_buf;
  }
  return local_4;
}

Assistant:

int
hex_encode(const void* in_buf, unsigned in_size,
           char* out_buf, unsigned out_size, int lowercase)
{
    static const char lower_xdigits[16] = "0123456789abcdef";
    static const char upper_xdigits[16] = "0123456789ABCDEF";

    const char* xdigits = (lowercase ? lower_xdigits : upper_xdigits);
    const unsigned char* in;
    const unsigned char* in_end;
    char* out;
    char* out_end;

    if(out_buf == NULL)
        return in_size * 2 + 1;

    if(out_size < in_size * 2)
        return -1;

    in = (const unsigned char*) in_buf;
    in_end = in + in_size;
    out = out_buf;
    out_end = out + out_size;

    while(in < in_end  &&  out + 1 < out_end) {
        *out++ = xdigits[(*in & 0xf0) >> 4];
        *out++ = xdigits[(*in & 0x0f)];
        in++;
    }

    /* If enough space in the output buffer, append zero terminator. */
    if(out < out_end)
        *out = '\0';

    return out - out_buf;
}